

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::Attributes,_std::shared_ptr<anurbs::Attributes>_> * __thiscall
pybind11::class_<anurbs::Attributes,std::shared_ptr<anurbs::Attributes>>::
def<std::__cxx11::string(anurbs::Attributes::*)()const>
          (class_<anurbs::Attributes,std::shared_ptr<anurbs::Attributes>> *this,char *name_,
          offset_in_Model_to_subr *f)

{
  offset_in_Model_to_subr f_00;
  name *extra;
  cpp_function cf;
  handle local_60;
  cpp_function local_58;
  handle local_50;
  object local_48;
  char *local_40 [4];
  PyObject *local_20;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_60.m_ptr = *(PyObject **)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40[0] = name_;
  getattr((pybind11 *)&local_50,local_60,name_,(PyObject *)&_Py_NoneStruct);
  local_20 = local_50.m_ptr;
  cpp_function::
  cpp_function<std::__cxx11::string,anurbs::Attributes,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_58,f_00,extra,(is_method *)local_40,(sibling *)&local_60);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object(&local_48);
  cpp_function::name((cpp_function *)&local_60);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_40,(object_api<pybind11::handle> *)this,local_60);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_40,&local_58);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_40);
  pybind11::object::~object((object *)&local_60);
  pybind11::object::~object((object *)&local_58);
  return (class_<anurbs::Attributes,_std::shared_ptr<anurbs::Attributes>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }